

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O0

string * convert_pub_filename(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  long lVar2;
  char *local_28;
  char *p;
  string *s_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = (char *)std::__cxx11::string::operator[]((ulong)s); *local_28 != '\0';
      local_28 = local_28 + 1) {
    lVar1 = std::__cxx11::string::operator[]((ulong)s);
    lVar2 = std::__cxx11::string::size();
    if (((((ulong)((long)local_28 - lVar1) < lVar2 - 3U) && (*local_28 == '0')) &&
        (local_28[1] == '0')) && (local_28[2] == '1')) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%03d");
      local_28 = local_28 + 2;
    }
    else {
      if (*local_28 == '%') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convert_pub_filename(const std::string& s)
{
	std::string result;

	for (const char* p = &s[0]; *p != '\0'; ++p)
	{
		if ((p - &s[0]) < s.size() - 3 && p[0] == '0' && p[1] == '0' && p[2] == '1')
		{
			result += "%03d";
			p += 2;
			continue;
		}

		if (*p == '%')
			result += '%';

		result += *p;
	}

	return result;
}